

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleTypeHandler.cpp
# Opt level: O0

BOOL __thiscall
Js::SimpleTypeHandler<6UL>::PreventExtensions(SimpleTypeHandler<6UL> *this,DynamicObject *instance)

{
  int iVar1;
  DictionaryTypeHandler *pDVar2;
  DynamicObject *instance_local;
  SimpleTypeHandler<6UL> *this_local;
  
  pDVar2 = ConvertToDictionaryType(this,instance);
  iVar1 = (*(pDVar2->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar2,instance);
  return iVar1;
}

Assistant:

BOOL SimpleTypeHandler<size>::PreventExtensions(DynamicObject* instance)
    {
        return ConvertToDictionaryType(instance)->PreventExtensions(instance);
    }